

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventDispatcher.cpp
# Opt level: O0

int __thiscall EventDispatcher::removeAll(EventDispatcher *this)

{
  uint uVar1;
  SyncRetEventAgent0<EventDispatcher,_int> *this_00;
  ssize_t sVar2;
  TimerManager *this_01;
  size_t __n;
  void *__buf;
  int in_R8D;
  TimerManager *timerMan;
  SyncRetEventAgent0<EventDispatcher,_int> *e;
  EventDispatcher *this_local;
  
  uVar1 = (*(this->super_IEventDispatcher)._vptr_IEventDispatcher[7])();
  if ((uVar1 & 1) == 0) {
    this_00 = (SyncRetEventAgent0<EventDispatcher,_int> *)
              operator_new(0x30,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/src/EventDispatcher.cpp"
                           ,0x118);
    __n = 0;
    SyncRetEventAgent0<EventDispatcher,_int>::SyncRetEventAgent0(this_00,this,0x31);
    Event::setPriority((Event *)this_00,1);
    sVar2 = SyncRetEventAgent<int>::send
                      ((SyncRetEventAgent<int> *)this_00,(int)this,__buf,__n,in_R8D);
    this_local._4_4_ = (int)sVar2;
  }
  else {
    this_01 = TimerManager::getInstance();
    TimerManager::removeTimedEvent(this_01,-1,&this->super_IEventDispatcher);
    EventQueue::Flush(&this->mQueue);
    this_local._4_4_ = 0;
  }
  return this_local._4_4_;
}

Assistant:

int EventDispatcher::removeAll()
{
	if (not isThreadCurrent())
	{
		SyncRetEventAgent0<EventDispatcher, int>* e = 
			jh_new SyncRetEventAgent0<EventDispatcher, int>
			(this, &EventDispatcher::removeAll);

		// I am a bad person, but it's either this or make all
		// EventAgent's publicly inherit from Event (instead of
		// Protected inheritance), and that's a big ugly change for
		// little benefit.
		((Event*)e)->setPriority(PRIORITY_HIGH);

		return e->send(this);
	}

	// Same a remove exept we give TimerManager an invalid id so that he will
	//  remove all events for this dispatcher.
	TimerManager *timerMan = TimerManager::getInstance();
	timerMan->removeTimedEvent( Event::kInvalidEventId, this );
	mQueue.Flush();
	return 0;
}